

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_compliance_ut.c
# Opt level: O1

int pal_temperature_get_with_null_pointer_fail(void)

{
  pal_result pVar1;
  
  puts("Execute test pal_temperature_get_with_null_pointer_fail\r");
  pVar1 = pal_temperature_get((unsigned_short *)0x0);
  if (pVar1 != PAL_ERROR_ARG) {
    printf("pal_temperature_get return failed. Expected:PAL_ERROR_ARG Actual:%u\r\n\r\n",
           (ulong)pVar1);
  }
  else {
    puts("Succeeded\r\n\r");
  }
  return (uint)(pVar1 != PAL_ERROR_ARG);
}

Assistant:

int pal_temperature_get_with_null_pointer_fail(void) {
    printf("Execute test pal_temperature_get_with_null_pointer_fail\r\n");
    ///arrange

    ///act
    pal_result result = pal_temperature_get(NULL);

    ///assert
    if (result != PAL_ERROR_ARG) {
        printf("pal_temperature_get return failed. Expected:PAL_ERROR_ARG Actual:%u\r\n\r\n", result);
        return 1;
    }
    printf("Succeeded\r\n\r\n");
    return 0;
}